

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  iterator iVar1;
  DataTable *this;
  DataTableObservable *this_00;
  DataTableObserver *o;
  DataTableObserver *o_00;
  int local_34 [3];
  
  this = (DataTable *)operator_new(0x20);
  DataTable::DataTable(this);
  local_34[0] = 5;
  iVar1._M_current =
       (this->_table).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar1._M_current ==
      (this->_table).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->_table,iVar1,local_34);
  }
  else {
    *iVar1._M_current = 5;
    (this->_table).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  local_34[1] = 7;
  iVar1._M_current =
       (this->_table).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar1._M_current ==
      (this->_table).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->_table,iVar1,local_34 + 1);
  }
  else {
    *iVar1._M_current = 7;
    (this->_table).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  local_34[2] = 9;
  iVar1._M_current =
       (this->_table).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar1._M_current ==
      (this->_table).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->_table,iVar1,local_34 + 2);
  }
  else {
    *iVar1._M_current = 9;
    (this->_table).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  this_00 = (DataTableObservable *)operator_new(0x20);
  DataTableObservable::DataTableObservable(this_00);
  o = (DataTableObserver *)operator_new(0x10);
  HistogramOvserver::HistogramOvserver((HistogramOvserver *)o,this);
  o_00 = (DataTableObserver *)operator_new(0x10);
  NumberObserver::NumberObserver((NumberObserver *)o_00,this);
  DataTableObservable::addObserver(this_00,o);
  DataTableObservable::addObserver(this_00,o_00);
  DataTableObservable::notifyAll(this_00);
  DataTable::set(this,1,2);
  DataTableObservable::notifyAll(this_00);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	DataTable *table = new DataTable();
	table->append(5);
	table->append(7);
	table->append(9);

	DataTableObservable* observable = new DataTableObservable();

	DataTableObserver* hobserver = new HistogramOvserver(table);
	DataTableObserver* numobserver = new NumberObserver(table);

	observable->addObserver(hobserver);
	observable->addObserver(numobserver);

	observable->notifyAll();

	table->set(1, 2);

	observable->notifyAll();

	return 0;
}